

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_retrieving_after_no_change_returns_null_Test::TestBody
          (SubjectSetRegisterTest_test_retrieving_after_no_change_returns_null_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_378;
  AssertHelper local_358;
  Message local_350;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_348;
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__2;
  string local_2a8;
  AssertHelper local_288;
  Message local_280;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_278;
  bool local_201;
  undefined1 local_200 [8];
  AssertionResult gtest_ar__1;
  Subject local_180 [24];
  string local_168;
  AssertHelper local_148;
  Message local_140 [3];
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_128;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_test_retrieving_after_no_change_returns_null_Test *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister
            ((SubjectSetRegister *)&gtest_ar_.message_);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  local_b1 = std::optional::operator_cast_to_bool((optional *)&local_128);
  local_b1 = !local_b1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_168,(internal *)local_b0,
               (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x245,pcVar2);
    testing::internal::AssertHelper::operator=(&local_148,local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    testing::Message::~Message(local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  bidfx_public_api::price::subject::Subject::Subject(local_180,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&gtest_ar_.message_,local_180,0);
  subject::Subject::~Subject(local_180);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar__1.message_);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  local_201 = std::optional::operator_cast_to_bool((optional *)&local_278);
  local_201 = !local_201;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_200,&local_201,(type *)0x0);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2a8,(internal *)local_200,
               (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x249,pcVar2);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&gtest_ar__2.message_,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register
            (&gtest_ar_.message_,&gtest_ar__2.message_,0);
  subject::Subject::~Subject((Subject *)&gtest_ar__2.message_);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  local_2d1 = std::optional::operator_cast_to_bool((optional *)&local_348);
  local_2d1 = !local_2d1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_378,(internal *)local_2d0,
               (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x24c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  SubjectSetRegister::~SubjectSetRegister((SubjectSetRegister *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_retrieving_after_no_change_returns_null)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    EXPECT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Register(SS_SUBJECT0, false);
    subject_register.NextSubscriptionSync();
    EXPECT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Register(SS_SUBJECT0, false);
    EXPECT_FALSE(subject_register.NextSubscriptionSync());
}